

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O1

int Cudd_bddLeq(DdManager *dd,DdNode *f,DdNode *g)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *g_00;
  DdNode *f_00;
  DdNode *g_01;
  bool bVar10;
  
  bVar10 = true;
  if (f == g) goto LAB_007c262a;
  if (((ulong)g & 1) == 0) {
    g_01 = g;
    if (((ulong)f & 1) != 0) {
      lVar4 = g->Id * 2;
      pDVar7 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
      lVar3 = pDVar7->Id;
      lVar5 = lVar3 * 2;
      if (lVar4 == lVar5 || SBORROW8(lVar4,lVar5) != lVar4 + lVar3 * -2 < 0) {
        f = (DdNode *)((ulong)g | 1);
        g_01 = pDVar7;
      }
    }
LAB_007c25df:
    pDVar7 = dd->one;
    if (g_01 == pDVar7) goto LAB_007c262a;
    if ((f != pDVar7) && (g_01 != (DdNode *)((ulong)f ^ 1))) {
      if (f != (DdNode *)((ulong)pDVar7 ^ 1)) {
        pDVar8 = cuddCacheLookup2(dd,Cudd_bddLeq,f,g_01);
        if (pDVar8 == (DdNode *)0x0) {
          pDVar9 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
          uVar1 = dd->perm[pDVar9->index];
          uVar2 = dd->perm[g_01->index];
          f_00 = f;
          pDVar8 = f;
          if (uVar1 <= uVar2) {
            pDVar8 = (pDVar9->type).kids.T;
            f_00 = (pDVar9->type).kids.E;
            if (f != pDVar9) {
              pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
              f_00 = (DdNode *)((ulong)f_00 ^ 1);
            }
          }
          g_00 = g_01;
          pDVar9 = g_01;
          if (uVar2 <= uVar1) {
            pDVar9 = (g_01->type).kids.T;
            g_00 = (g_01->type).kids.E;
          }
          iVar6 = Cudd_bddLeq(dd,f_00,g_00);
          if (iVar6 == 0) {
            bVar10 = false;
          }
          else {
            iVar6 = Cudd_bddLeq(dd,pDVar8,pDVar9);
            bVar10 = iVar6 != 0;
          }
          pDVar8 = (DdNode *)((ulong)pDVar7 ^ 1);
          if (bVar10 != false) {
            pDVar8 = pDVar7;
          }
          cuddCacheInsert2(dd,Cudd_bddLeq,f,g_01,pDVar8);
        }
        else {
          bVar10 = pDVar8 == pDVar7;
        }
      }
      goto LAB_007c262a;
    }
  }
  else if (((ulong)f & 1) != 0) {
    g_01 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    f = (DdNode *)((ulong)g & 0xfffffffffffffffe);
    goto LAB_007c25df;
  }
  bVar10 = false;
LAB_007c262a:
  return (int)bVar10;
}

Assistant:

int
Cudd_bddLeq(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *one, *zero, *tmp, *F, *fv, *fvn, *gv, *gvn;
    unsigned int topf, topg, res;

    statLine(dd);
    /* Terminal cases and normalization. */
    if (f == g) return(1);

    if (Cudd_IsComplement(g)) {
        /* Special case: if f is regular and g is complemented,
        ** f(1,...,1) = 1 > 0 = g(1,...,1).
        */
        if (!Cudd_IsComplement(f)) return(0);
        /* Both are complemented: Swap and complement because
        ** f <= g <=> g' <= f' and we want the second argument to be regular.
        */
        tmp = g;
        g = Cudd_Not(f);
        f = Cudd_Not(tmp);
    } else if (Cudd_IsComplement(f) && cuddF2L(g) < cuddF2L(f)) {
        tmp = g;
        g = Cudd_Not(f);
        f = Cudd_Not(tmp);
    }

    /* Now g is regular and, if f is not regular, f < g. */
    one = DD_ONE(dd);
    if (g == one) return(1);    /* no need to test against zero */
    if (f == one) return(0);    /* since at this point g != one */
    if (Cudd_Not(f) == g) return(0); /* because neither is constant */
    zero = Cudd_Not(one);
    if (f == zero) return(1);

    /* Here neither f nor g is constant. */

    /* Check cache. */
    tmp = cuddCacheLookup2(dd,(DD_CTFP)Cudd_bddLeq,f,g);
    if (tmp != NULL) {
        return(tmp == one);
    }

    /* Compute cofactors. */
    F = Cudd_Regular(f);
    topf = dd->perm[F->index];
    topg = dd->perm[g->index];
    if (topf <= topg) {
        fv = cuddT(F); fvn = cuddE(F);
        if (f != F) {
            fv = Cudd_Not(fv);
            fvn = Cudd_Not(fvn);
        }
    } else {
        fv = fvn = f;
    }
    if (topg <= topf) {
        gv = cuddT(g); gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    /* Recursive calls. Since we want to maximize the probability of
    ** the special case f(1,...,1) > g(1,...,1), we consider the negative
    ** cofactors first. Indeed, the complementation parity of the positive
    ** cofactors is the same as the one of the parent functions.
    */
    res = Cudd_bddLeq(dd,fvn,gvn) && Cudd_bddLeq(dd,fv,gv);

    /* Store result in cache and return. */
    cuddCacheInsert2(dd,(DD_CTFP)Cudd_bddLeq,f,g,(res ? one : zero));
    return(res);

}